

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool.hh
# Opt level: O3

void * __thiscall
tchecker::pool_t<tchecker::make_shared_t<tchecker::vedge_t,_unsigned_long,_1UL>_>::allocate
          (pool_t<tchecker::make_shared_t<tchecker::vedge_t,_unsigned_long,_1UL>_> *this)

{
  pointer psVar1;
  ulong uVar2;
  char *chunk;
  char *pcVar3;
  shared_ptr<tchecker::collectable_t> *collectable;
  pointer psVar4;
  
  pcVar3 = this->_raw_head;
  if (pcVar3 == this->_raw_end) {
    pcVar3 = this->_free_head;
    if (pcVar3 == (char *)0x0) {
      psVar1 = (this->_collectables).
               super__Vector_base<std::shared_ptr<tchecker::collectable_t>,_std::allocator<std::shared_ptr<tchecker::collectable_t>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (psVar4 = (this->_collectables).
                    super__Vector_base<std::shared_ptr<tchecker::collectable_t>,_std::allocator<std::shared_ptr<tchecker::collectable_t>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; psVar4 != psVar1; psVar4 = psVar4 + 1
          ) {
        (*((psVar4->super___shared_ptr<tchecker::collectable_t,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
          ->_vptr_collectable_t[2])();
      }
      collect(this);
      pcVar3 = this->_free_head;
      if (pcVar3 == (char *)0x0) {
        if (this->_raw_head != this->_raw_end) {
          __assert_fail("_raw_head == _raw_end",
                        "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/utils/pool.hh"
                        ,0x1a5,
                        "void tchecker::pool_t<tchecker::make_shared_t<tchecker::vedge_t>>::allocate_raw_block() [T = tchecker::make_shared_t<tchecker::vedge_t>]"
                       );
        }
        uVar2 = this->_block_size;
        pcVar3 = (char *)operator_new__(uVar2);
        this->_raw_end = pcVar3 + uVar2;
        *(char **)pcVar3 = this->_block_head;
        this->_block_head = pcVar3;
        pcVar3 = pcVar3 + 8;
        this->_raw_head = pcVar3;
        this->_blocks_count = this->_blocks_count + 1;
        if (uVar2 == 8) {
          __assert_fail("_raw_head != _raw_end",
                        "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/utils/pool.hh"
                        ,0x1b9,
                        "void *tchecker::pool_t<tchecker::make_shared_t<tchecker::vedge_t>>::allocate_chunk_from_raw_block() [T = tchecker::make_shared_t<tchecker::vedge_t>]"
                       );
        }
        goto LAB_001754a2;
      }
    }
    this->_free_head = *(char **)(pcVar3 + 8);
  }
  else {
LAB_001754a2:
    this->_raw_head = pcVar3 + this->_alloc_size;
  }
  pcVar3[0] = '\0';
  pcVar3[1] = '\0';
  pcVar3[2] = '\0';
  pcVar3[3] = '\0';
  pcVar3[4] = '\0';
  pcVar3[5] = '\0';
  pcVar3[6] = '\0';
  pcVar3[7] = '\0';
  return pcVar3;
}

Assistant:

inline void * allocate()
  {
    // Allocate from the raw block if possible
    if (_raw_head != _raw_end) {
      typename T::refcount_t * chunk = reinterpret_cast<typename T::refcount_t *>(allocate_chunk_from_raw_block());
      *chunk = 0; // set reference counter
      return chunk;
    }

    // Allocate from the free list, collect first if needed
    if (_free_head == nullptr) {
      // collect unsued objects from registered collectables
      for (std::shared_ptr<tchecker::collectable_t> const & collectable : _collectables)
        collectable->collect();
      // then collect free chunks of memory
      collect();
    }

    if (_free_head != nullptr) {
      typename T::refcount_t * chunk = reinterpret_cast<typename T::refcount_t *>(allocate_chunk_from_free_list());
      *chunk = 0; // set reference counter
      return chunk;
    }

    // Allocate a new raw block, and allocate from the block
    allocate_raw_block();
    typename T::refcount_t * chunk = reinterpret_cast<typename T::refcount_t *>(allocate_chunk_from_raw_block());
    *chunk = 0; // set reference counter
    return chunk;
  }